

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

int xmlShellCat(xmlShellCtxtPtr ctxt,char *arg,xmlNodePtr node,xmlNodePtr node2)

{
  xmlDocPtr doc;
  FILE *f;
  
  if (ctxt != (xmlShellCtxtPtr)0x0) {
    if (node == (xmlNodePtr)0x0) {
      fwrite("NULL\n",5,1,(FILE *)ctxt->output);
    }
    else {
      doc = ctxt->doc;
      f = ctxt->output;
      if (doc->type == XML_HTML_DOCUMENT_NODE) {
        if (node->type == XML_HTML_DOCUMENT_NODE) {
          htmlDocDump(f,(xmlDocPtr)node);
        }
        else {
          htmlNodeDumpFile(f,doc,node);
        }
      }
      else if (node->type == XML_DOCUMENT_NODE) {
        xmlDocDump(f,(xmlDocPtr)node);
      }
      else {
        xmlElemDump(f,doc,node);
      }
      fputc(10,(FILE *)ctxt->output);
    }
  }
  return 0;
}

Assistant:

int
xmlShellCat(xmlShellCtxtPtr ctxt, char *arg ATTRIBUTE_UNUSED,
            xmlNodePtr node, xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    if (!ctxt)
        return (0);
    if (node == NULL) {
	fprintf(ctxt->output, "NULL\n");
	return (0);
    }
    if (ctxt->doc->type == XML_HTML_DOCUMENT_NODE) {
#ifdef LIBXML_HTML_ENABLED
        if (node->type == XML_HTML_DOCUMENT_NODE)
            htmlDocDump(ctxt->output, (htmlDocPtr) node);
        else
            htmlNodeDumpFile(ctxt->output, ctxt->doc, node);
#else
        if (node->type == XML_DOCUMENT_NODE)
            xmlDocDump(ctxt->output, (xmlDocPtr) node);
        else
            xmlElemDump(ctxt->output, ctxt->doc, node);
#endif /* LIBXML_HTML_ENABLED */
    } else {
        if (node->type == XML_DOCUMENT_NODE)
            xmlDocDump(ctxt->output, (xmlDocPtr) node);
        else
            xmlElemDump(ctxt->output, ctxt->doc, node);
    }
    fprintf(ctxt->output, "\n");
    return (0);
}